

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  undefined2 *puVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  undefined4 in_register_0000003c;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar10;
  ulong uVar11;
  char *__s;
  char format [7];
  char local_5f;
  undefined1 local_5e [2];
  undefined1 auStack_5c [4];
  long local_58;
  longdouble local_4c;
  undefined8 local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_0000003c,precision);
  local_4c = value;
  local_38 = (ulong)specs >> 0x20;
  uVar4 = 5;
  if (-1 < precision) {
    uVar4 = precision - 1;
  }
  bVar7 = specs._4_1_;
  uVar10 = (ulong)uVar4;
  if (1 < bVar7) {
    uVar10 = (ulong)(uint)precision;
  }
  local_5f = '%';
  if (bVar7 == 3 && (specs._4_4_ >> 0x14 & 1) != 0) {
    puVar5 = (undefined2 *)(local_5e + 1);
    local_5e[0] = 0x23;
  }
  else {
    puVar5 = (undefined2 *)local_5e;
  }
  if (-1 < (int)uVar10) {
    *puVar5 = 0x2a2e;
    puVar5 = puVar5 + 1;
  }
  *(undefined1 *)puVar5 = 0x4c;
  if (bVar7 == 3) {
    bVar7 = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar7 = (bVar7 == 2) + 0x65;
  }
  *(byte *)((long)puVar5 + 1) = bVar7;
  *(undefined1 *)(puVar5 + 1) = 0;
  sVar2 = buf->size_;
  local_58 = sVar2 + 1;
LAB_00152d42:
  while( true ) {
    __s = buf->ptr_ + sVar2;
    uVar8 = buf->capacity_ - sVar2;
    if ((int)uVar10 < 0) {
      uVar4 = snprintf(__s,uVar8,&local_5f);
    }
    else {
      uVar4 = snprintf(__s,uVar8,&local_5f,uVar10,in_R8,in_R9,local_4c);
    }
    uVar11 = (ulong)uVar4;
    if ((int)uVar4 < 0) goto LAB_00152db2;
    if (uVar11 < uVar8) break;
    uVar11 = local_58 + uVar11;
    if (buf->capacity_ < uVar11) goto LAB_00152dbf;
  }
  if ((char)local_38 == '\x02') {
    if ((int)local_40 != 0) {
      uVar10 = 1;
      do {
        lVar6 = uVar10 + (uVar11 - 2);
        uVar10 = uVar10 - 1;
      } while ((byte)(__s[lVar6] - 0x30U) < 10);
      memmove(__s + uVar10 + uVar11 + -1,__s + uVar10 + uVar11,(ulong)(uint)-(int)uVar10);
      uVar11 = (ulong)(uVar4 - 1);
      uVar8 = buf->capacity_;
      if (uVar8 < uVar11) {
        (**buf->_vptr_buffer)(buf,uVar11);
        uVar8 = buf->capacity_;
      }
      if (uVar8 < uVar11) {
        uVar11 = uVar8;
      }
      buf->size_ = uVar11;
      goto LAB_00152f39;
    }
    uVar10 = buf->capacity_;
    if (uVar10 < uVar11) {
      (**buf->_vptr_buffer)(buf,uVar11);
      uVar10 = buf->capacity_;
    }
    if (uVar11 <= uVar10) {
      uVar10 = uVar11;
    }
    buf->size_ = uVar10;
  }
  else {
    if (((uint)local_38 & 0xff) != 3) {
      lVar6 = -2;
      uVar10 = uVar11 - 1;
      do {
        uVar8 = uVar10;
        lVar6 = lVar6 + 1;
        uVar10 = uVar8 - 1;
      } while (__s[uVar8] != 'e');
      lVar6 = -lVar6;
      iVar9 = 0;
      do {
        iVar9 = (int)__s[lVar6 + uVar11] + iVar9 * 10 + -0x30;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0);
      iVar3 = -iVar9;
      if (__s[uVar8 + 1] != '-') {
        iVar3 = iVar9;
      }
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        do {
          pcVar1 = __s + uVar10;
          uVar10 = uVar10 - 1;
        } while (*pcVar1 == '0');
        memmove(__s + 1,__s + 2,uVar10 & 0xffffffff);
      }
      uVar11 = local_58 + (uVar10 & 0xffffffff);
      uVar8 = buf->capacity_;
      if (uVar8 < uVar11) {
        (**buf->_vptr_buffer)(buf,uVar11);
        uVar8 = buf->capacity_;
      }
      if (uVar8 < uVar11) {
        uVar11 = uVar8;
      }
      buf->size_ = uVar11;
      uVar10 = (ulong)(uint)(iVar3 - (int)uVar10);
      goto LAB_00152f39;
    }
    uVar11 = sVar2 + uVar11;
    uVar10 = buf->capacity_;
    if (uVar10 < uVar11) {
      (**buf->_vptr_buffer)(buf,uVar11);
      uVar10 = buf->capacity_;
    }
    if (uVar10 < uVar11) {
      uVar11 = uVar10;
    }
    buf->size_ = uVar11;
  }
  uVar10 = 0;
LAB_00152f39:
  return (int)uVar10;
LAB_00152db2:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar11 = buf->capacity_ + 1;
LAB_00152dbf:
    (**buf->_vptr_buffer)(buf,uVar11);
  }
  goto LAB_00152d42;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}